

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFragOpInteractionCase.cpp
# Opt level: O2

IterateResult __thiscall deqp::gls::FragOpInteractionCase::iterate(FragOpInteractionCase *this)

{
  int *value;
  float fVar1;
  Type TVar2;
  TestLog *pTVar3;
  Variable *pVVar4;
  ShaderInput *pSVar5;
  TextureFormat TVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long *plVar9;
  pointer pSVar10;
  pointer pRVar11;
  bool bVar12;
  bool bVar13;
  uint uVar14;
  deBool dVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  undefined4 uVar21;
  int iVar22;
  deUint32 err;
  RGBA threshold;
  pointer pVVar23;
  pointer pRVar24;
  ulong uVar25;
  undefined4 extraout_var;
  undefined8 *puVar26;
  undefined4 extraout_var_00;
  TestError *this_00;
  InternalError *pIVar27;
  int iVar28;
  ulong uVar29;
  float *pfVar30;
  IterateResult IVar31;
  long lVar32;
  pointer pRVar33;
  pointer pVVar34;
  ulong uVar35;
  pointer_____offset_0x10___ *ppuVar36;
  const_iterator cmdIter;
  int ndx;
  long lVar37;
  pointer ppSVar38;
  long lVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  Type TVar44;
  undefined4 uVar45;
  Type TVar46;
  ConstStridedValueAccess<1> CVar47;
  Vector<float,_3> result;
  deUint16 indices [6];
  VertexArrayBinding layoutEntry;
  VertexArrayPointer posPtr;
  _Vector_base<deqp::gls::(anonymous_namespace)::RenderCommand,_std::allocator<deqp::gls::(anonymous_namespace)::RenderCommand>_>
  local_1a0;
  VertexDataStorage vertexData;
  ScopedLogSection section;
  vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_> uniformValues;
  PixelBufferAccess readDst [2];
  undefined8 local_c0;
  Surface rendered;
  Surface reference;
  Random rnd;
  string local_78;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  uVar14 = ((uint)this->m_iterNdx >> 0x10 ^ this->m_iterNdx ^ 0x3d) * 9;
  uVar14 = (uVar14 >> 4 ^ uVar14) * 0x27d4eb2d;
  deRandom_init(&rnd.m_rnd,uVar14 >> 0xf ^ (this->m_params).seed ^ uVar14);
  pTVar3 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)readDst,"Iter",(allocator<char> *)&local_1a0);
  value = &this->m_iterNdx;
  de::toString<int>(&local_78,value);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&layoutEntry,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)readDst,
                 &local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&posPtr,"Iteration ",(allocator<char> *)&rendered);
  de::toString<int>((string *)&uniformValues,value);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vertexData,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&posPtr,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&uniformValues
                );
  tcu::ScopedLogSection::ScopedLogSection
            (&section,pTVar3,(string *)&layoutEntry,(string *)&vertexData);
  std::__cxx11::string::~string((string *)&vertexData);
  std::__cxx11::string::~string((string *)&uniformValues);
  std::__cxx11::string::~string((string *)&posPtr);
  std::__cxx11::string::~string((string *)&layoutEntry);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)readDst);
  lVar37 = 0;
  while( true ) {
    ppSVar38 = (this->m_vertexShader).m_inputs.
               super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(this->m_vertexShader).m_inputs.
                            super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar38) >> 3) <=
        lVar37) {
      pIVar27 = (InternalError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)readDst,"dEQP_Position",(allocator<char> *)&local_78);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &layoutEntry,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)readDst,
                     " not found in shader inputs");
      tcu::InternalError::InternalError(pIVar27,(string *)&layoutEntry);
      __cxa_throw(pIVar27,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
    }
    dVar15 = deStringEqual((ppSVar38[lVar37]->m_variable->m_name)._M_dataplus._M_p,"dEQP_Position");
    if (dVar15 != 0) break;
    lVar37 = lVar37 + 1;
  }
  vertexData.m_layout.
  super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vertexData.m_layout.
  super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vertexData.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vertexData.m_layout.
  super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vertexData.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vertexData.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar20 = 0;
  for (ppSVar38 = (this->m_vertexShader).m_inputs.
                  super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      pVVar23 = vertexData.m_layout.
                super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                ._M_impl.super__Vector_impl_data._M_start,
      ppSVar38 !=
      (this->m_vertexShader).m_inputs.
      super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppSVar38 = ppSVar38 + 1) {
    pVVar4 = (*ppSVar38)->m_variable;
    if (((pVVar4->m_type).m_baseType != TYPE_FLOAT) ||
       (iVar28 = (pVVar4->m_type).m_numElements, 3 < iVar28 - 1U)) {
      pIVar27 = (InternalError *)__cxa_allocate_exception(0x38);
      tcu::InternalError::InternalError
                (pIVar27,(char *)0x0,
                 "type.getBaseType() == rsg::VariableType::TYPE_FLOAT && de::inRange(type.getNumElements(), 1, 4)"
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsFragOpInteractionCase.cpp"
                 ,0x5c);
      __cxa_throw(pIVar27,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)readDst,(pVVar4->m_name)._M_dataplus._M_p,(allocator<char> *)&local_78);
    glu::va::Float(&layoutEntry,(string *)readDst,iVar28,4,0,(float *)(long)iVar20);
    std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
    emplace_back<glu::VertexArrayBinding>(&vertexData.m_layout,&layoutEntry);
    std::__cxx11::string::~string((string *)&layoutEntry.binding.name);
    std::__cxx11::string::~string((string *)readDst);
    iVar20 = iVar20 + iVar28 * 4;
  }
  for (; pVVar23 !=
         vertexData.m_layout.
         super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
         _M_impl.super__Vector_impl_data._M_finish; pVVar23 = pVVar23 + 1) {
    (pVVar23->pointer).stride = iVar20;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&vertexData.m_data,(long)(iVar20 << 2));
  uniformValues.super__Vector_base<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  uniformValues.super__Vector_base<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uniformValues.super__Vector_base<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pRVar24 = (pointer)operator_new(800);
  local_1a0._M_impl.super__Vector_impl_data._M_end_of_storage = pRVar24 + 5;
  local_1a0._M_impl.super__Vector_impl_data._M_start = pRVar24;
  local_1a0._M_impl.super__Vector_impl_data._M_finish = pRVar24;
  for (lVar32 = -5; lVar32 != 0; lVar32 = lVar32 + 1) {
    *(undefined8 *)(pRVar24->quad).posA.m_data = 0;
    *(undefined8 *)(pRVar24->quad).posB.m_data = 0;
    pRVar24->depth = 0.0;
    InteractionTestUtil::RenderState::RenderState(&pRVar24->state);
    pRVar24 = pRVar24 + 1;
  }
  local_1a0._M_impl.super__Vector_impl_data._M_finish = pRVar24;
  tcu::Surface::Surface(&rendered,(this->m_viewportSize).m_data[0],(this->m_viewportSize).m_data[1])
  ;
  tcu::Surface::Surface
            (&reference,(this->m_viewportSize).m_data[0],(this->m_viewportSize).m_data[1]);
  local_78._M_dataplus._M_p = (pointer)0x0;
  local_78._M_string_length = 0x3f80000000000000;
  local_78.field_2._M_allocated_capacity = 0x3f800000;
  local_78.field_2._8_8_ = 0x3f0000003f000000;
  local_58 = 0x3f80000000000000;
  uStack_50 = 0x3f0000003f000000;
  local_48 = 0x3f8000003f800000;
  uStack_40 = 0x3f800000;
  rsg::computeUniformValues(&rnd,&uniformValues,&this->m_unifiedUniforms);
  for (lVar32 = 0;
      ppSVar38 = (this->m_vertexShader).m_inputs.
                 super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl
                 .super__Vector_impl_data._M_start,
      lVar32 < (int)((ulong)((long)(this->m_vertexShader).m_inputs.
                                   super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar38) >> 3
                    ); lVar32 = lVar32 + 1) {
    if (lVar37 != lVar32) {
      pSVar5 = ppSVar38[lVar32];
      TVar6 = (TextureFormat)pSVar5->m_variable;
      uVar7 = (pSVar5->m_min).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_start;
      uVar8 = (pSVar5->m_max).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_start;
      iVar20 = *(int *)((long)TVar6 + 0x28);
      anon_unknown_0::getEntryWithPointer(&layoutEntry,&vertexData,(int)lVar32);
      for (iVar28 = 0; iVar28 != 4; iVar28 = iVar28 + 1) {
        if (iVar20 - 1U < 4) {
          switch(iVar20) {
          case 1:
            fVar40 = *(float *)&(&local_78._M_dataplus)
                                [(long)((iVar28 + (int)lVar32 + *value) % 4) * 2]._M_p;
            readDst[0].super_ConstPixelBufferAccess.m_format = TVar6;
            readDst[0].super_ConstPixelBufferAccess.m_size.m_data._0_8_ = uVar7;
            CVar47 = rsg::ConstStridedValueAccess<1>::component
                               ((ConstStridedValueAccess<1> *)readDst,0);
            fVar41 = (CVar47.m_value)->floatVal;
            posPtr._0_8_ = TVar6;
            posPtr._8_8_ = uVar8;
            CVar47 = rsg::ConstStridedValueAccess<1>::component
                               ((ConstStridedValueAccess<1> *)&posPtr,0);
            *(float *)((long)layoutEntry.pointer.data + (long)(layoutEntry.pointer.stride * iVar28))
                 = fVar40 * (CVar47.m_value)->floatVal + fVar41 * (1.0 - fVar40);
            break;
          case 2:
            tcu::Vector<float,_4>::toWidth<2>
                      ((Vector<float,_4> *)
                       (&local_78._M_dataplus + (long)((iVar28 + (int)lVar32 + *value) % 4) * 2));
            result.m_data[0] = 0.0;
            result.m_data[1] = 0.0;
            for (lVar39 = 0; lVar39 != 2; lVar39 = lVar39 + 1) {
              readDst[0].super_ConstPixelBufferAccess.m_format = TVar6;
              readDst[0].super_ConstPixelBufferAccess.m_size.m_data._0_8_ = uVar7;
              CVar47 = rsg::ConstStridedValueAccess<1>::component
                                 ((ConstStridedValueAccess<1> *)readDst,(int)lVar39);
              fVar40 = (CVar47.m_value)->floatVal;
              fVar41 = *(float *)(indices + lVar39 * 2);
              posPtr._0_8_ = TVar6;
              posPtr._8_8_ = uVar8;
              CVar47 = rsg::ConstStridedValueAccess<1>::component
                                 ((ConstStridedValueAccess<1> *)&posPtr,(int)lVar39);
              result.m_data[lVar39] =
                   (CVar47.m_value)->floatVal * *(float *)(indices + lVar39 * 2) +
                   fVar40 * (1.0 - fVar41);
            }
            for (lVar39 = 0; lVar39 != 2; lVar39 = lVar39 + 1) {
              *(float *)((long)layoutEntry.pointer.data +
                        lVar39 * 4 + (long)(layoutEntry.pointer.stride * iVar28)) =
                   result.m_data[lVar39];
            }
            break;
          case 3:
            tcu::Vector<float,_4>::toWidth<3>((Vector<float,_4> *)indices);
            tcu::Vector<float,_3>::Vector(&result);
            for (lVar39 = 0; lVar39 != 3; lVar39 = lVar39 + 1) {
              readDst[0].super_ConstPixelBufferAccess.m_format = TVar6;
              readDst[0].super_ConstPixelBufferAccess.m_size.m_data._0_8_ = uVar7;
              CVar47 = rsg::ConstStridedValueAccess<1>::component
                                 ((ConstStridedValueAccess<1> *)readDst,(int)lVar39);
              fVar40 = (CVar47.m_value)->floatVal;
              fVar41 = *(float *)(indices + lVar39 * 2);
              posPtr._0_8_ = TVar6;
              posPtr._8_8_ = uVar8;
              CVar47 = rsg::ConstStridedValueAccess<1>::component
                                 ((ConstStridedValueAccess<1> *)&posPtr,(int)lVar39);
              result.m_data[lVar39] =
                   (CVar47.m_value)->floatVal * *(float *)(indices + lVar39 * 2) +
                   fVar40 * (1.0 - fVar41);
            }
            for (lVar39 = 0; lVar39 != 3; lVar39 = lVar39 + 1) {
              *(float *)((long)layoutEntry.pointer.data +
                        lVar39 * 4 + (long)(layoutEntry.pointer.stride * iVar28)) =
                   result.m_data[lVar39];
            }
            break;
          case 4:
            tcu::Vector<float,_4>::toWidth<4>((Vector<float,_4> *)indices);
            tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&result);
            for (lVar39 = 0; lVar39 != 4; lVar39 = lVar39 + 1) {
              readDst[0].super_ConstPixelBufferAccess.m_format = TVar6;
              readDst[0].super_ConstPixelBufferAccess.m_size.m_data._0_8_ = uVar7;
              CVar47 = rsg::ConstStridedValueAccess<1>::component
                                 ((ConstStridedValueAccess<1> *)readDst,(int)lVar39);
              fVar40 = (CVar47.m_value)->floatVal;
              fVar41 = *(float *)(indices + lVar39 * 2);
              posPtr._0_8_ = TVar6;
              posPtr._8_8_ = uVar8;
              CVar47 = rsg::ConstStridedValueAccess<1>::component
                                 ((ConstStridedValueAccess<1> *)&posPtr,(int)lVar39);
              result.m_data[lVar39] =
                   (CVar47.m_value)->floatVal * *(float *)(indices + lVar39 * 2) +
                   fVar40 * (1.0 - fVar41);
            }
            anon_unknown_0::setVertex<4>(&layoutEntry.pointer,iVar28,(Vector<float,_4> *)&result);
          }
        }
      }
      std::__cxx11::string::~string((string *)&layoutEntry.binding.name);
    }
  }
  for (pRVar33 = local_1a0._M_impl.super__Vector_impl_data._M_start;
      pRVar11 = local_1a0._M_impl.super__Vector_impl_data._M_start, pRVar33 != pRVar24;
      pRVar33 = pRVar33 + 1) {
    uVar14 = (*this->m_renderCtx->_vptr_RenderContext[2])();
    iVar20 = (this->m_viewportSize).m_data[0];
    iVar28 = (this->m_viewportSize).m_data[1];
    fVar40 = ceilf((float)iVar20 * 0.5);
    iVar16 = de::Random::getInt(&rnd,(int)fVar40,iVar20);
    fVar40 = ceilf((float)iVar28 * 0.5);
    iVar17 = de::Random::getInt(&rnd,(int)fVar40,iVar28);
    iVar18 = de::Random::getInt(&rnd,0,iVar20 - iVar16);
    iVar19 = de::Random::getInt(&rnd,0,iVar28 - iVar17);
    bVar12 = de::Random::getBool(&rnd);
    bVar13 = de::Random::getBool(&rnd);
    iVar17 = iVar19 + iVar17 + -1;
    iVar22 = iVar19;
    if (bVar13) {
      iVar22 = iVar17;
    }
    iVar16 = iVar16 + -1 + iVar18;
    if (bVar13) {
      iVar17 = iVar19;
    }
    iVar19 = iVar16;
    if (bVar12) {
      iVar19 = iVar18;
      iVar18 = iVar16;
    }
    *(ulong *)(pRVar33->quad).posA.m_data = CONCAT44(iVar22,iVar18);
    *(ulong *)(pRVar33->quad).posB.m_data = CONCAT44(iVar17,iVar19);
    fVar40 = de::Random::choose<float,float_const*>
                       (&rnd,(float *)(anonymous_namespace)::getRandomDepth(de::Random&)::
                                      depthValues,(float *)&DAT_005ed110);
    pRVar33->depth = fVar40;
    InteractionTestUtil::computeRandomRenderState
              (&rnd,&pRVar33->state,(ApiType)(uVar14 & 0x3ff),iVar20,iVar28);
    pRVar24 = local_1a0._M_impl.super__Vector_impl_data._M_finish;
  }
  uVar25 = ((long)pRVar24 - (long)local_1a0._M_impl.super__Vector_impl_data._M_start) / 0xa0;
  uVar29 = 0;
  uVar35 = uVar25 & 0xffffffff;
  if ((int)uVar25 < 1) {
    uVar35 = uVar29;
  }
  pfVar30 = &(local_1a0._M_impl.super__Vector_impl_data._M_start)->depth;
  for (; uVar35 != uVar29; uVar29 = uVar29 + 1) {
    *pfVar30 = (float)(int)uVar29 * 0.0231725 + *pfVar30;
    pfVar30 = pfVar30 + 0x28;
  }
  anon_unknown_0::getEntryWithPointer(&layoutEntry,&vertexData,(int)lVar37);
  posPtr.data = layoutEntry.pointer.data;
  posPtr.componentType = layoutEntry.pointer.componentType;
  posPtr.convert = layoutEntry.pointer.convert;
  std::__cxx11::string::~string((string *)&layoutEntry.binding.name);
  result.m_data._0_8_ = this->m_glCtx;
  register0x00000000 = &this->m_referenceCtx->context;
  local_c0._0_4_ = this->m_glProgram;
  local_c0._4_4_ = this->m_refProgram;
  tcu::Surface::getAccess(readDst,&rendered);
  tcu::Surface::getAccess(readDst + 1,&reference);
  iVar20 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  lVar37 = CONCAT44(extraout_var,iVar20);
  fVar40 = anon_unknown_0::getWellBehavingChannelColor(0.0,*(int *)(lVar37 + 8));
  fVar41 = anon_unknown_0::getWellBehavingChannelColor(0.25,*(int *)(lVar37 + 0xc));
  fVar42 = anon_unknown_0::getWellBehavingChannelColor(0.5,*(int *)(lVar37 + 0x10));
  fVar43 = anon_unknown_0::getWellBehavingChannelColor(1.0,*(int *)(lVar37 + 0x14));
  lVar37 = 0;
  do {
    if (lVar37 == 2) {
      iVar20 = (*this->m_renderCtx->_vptr_RenderContext[4])();
      layoutEntry.binding.type =
           (Type)tcu::PixelFormat::getColorThreshold
                           ((PixelFormat *)(CONCAT44(extraout_var_00,iVar20) + 8));
      readDst[0].super_ConstPixelBufferAccess.m_format.order = 0x3030303;
      threshold = tcu::operator+((RGBA *)&layoutEntry,(RGBA *)readDst);
      pTVar3 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
      tcu::Surface::getAccess((PixelBufferAccess *)&layoutEntry,&reference);
      tcu::Surface::getAccess(readDst,&rendered);
      bVar12 = tcu::bilinearCompare
                         (pTVar3,"CompareResult","Image comparison result",
                          (ConstPixelBufferAccess *)&layoutEntry,
                          &readDst[0].super_ConstPixelBufferAccess,threshold,COMPARE_LOG_RESULT);
      if (bVar12) {
        iVar20 = *value;
        *value = iVar20 + 1;
        IVar31 = (IterateResult)(iVar20 + 1 < 5);
      }
      else {
        IVar31 = STOP;
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                   "Image comparison failed");
      }
      tcu::Surface::~Surface(&reference);
      tcu::Surface::~Surface(&rendered);
      std::
      _Vector_base<deqp::gls::(anonymous_namespace)::RenderCommand,_std::allocator<deqp::gls::(anonymous_namespace)::RenderCommand>_>
      ::~_Vector_base(&local_1a0);
      std::vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>::~vector(&uniformValues);
      anon_unknown_0::VertexDataStorage::~VertexDataStorage(&vertexData);
      tcu::ScopedLogSection::~ScopedLogSection(&section);
      return IVar31;
    }
    plVar9 = *(long **)(result.m_data + lVar37 * 2);
    uVar45 = *(undefined4 *)((long)&local_c0 + lVar37 * 4);
    for (iVar20 = 0;
        iVar20 < (int)(((long)vertexData.m_layout.
                              super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)vertexData.m_layout.
                             super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x50); iVar20 = iVar20 + 1
        ) {
      anon_unknown_0::getEntryWithPointer(&layoutEntry,&vertexData,iVar20);
      iVar28 = layoutEntry.binding.location;
      if (layoutEntry.binding.type == TYPE_NAME) {
        iVar28 = (**(code **)(*plVar9 + 0x2c8))
                           (plVar9,uVar45,
                            CONCAT44(layoutEntry.binding.name._M_dataplus._M_p._4_4_,
                                     layoutEntry.binding.name._M_dataplus._M_p._0_4_));
      }
      if (-1 < iVar28) {
        (**(code **)(*plVar9 + 0x280))(plVar9,iVar28);
        (**(code **)(*plVar9 + 0x270))
                  (plVar9,iVar28,layoutEntry.pointer.numComponents,0x1406,0,
                   layoutEntry.pointer.stride,layoutEntry.pointer.data);
      }
      std::__cxx11::string::~string((string *)&layoutEntry.binding.name);
    }
    (**(code **)(*plVar9 + 0x1a0))
              (plVar9,0xc11,
               ((long)vertexData.m_layout.
                      super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)vertexData.m_layout.
                     super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                     ._M_impl.super__Vector_impl_data._M_start) % 0x50);
    (**(code **)(*plVar9 + 0x220))(plVar9,1,1,1,1);
    (**(code **)(*plVar9 + 0x228))(plVar9,1);
    (**(code **)(*plVar9 + 0x230))(plVar9,0xffffffffffffffff);
    (**(code **)(*plVar9 + 0x150))(fVar40,fVar41,fVar42,fVar43,plVar9);
    (**(code **)(*plVar9 + 0x168))(plVar9,0x4500);
    (**(code **)(*plVar9 + 0x3b0))(plVar9,uVar45);
    for (pVVar34 = uniformValues.
                   super__Vector_base<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>.
                   _M_impl.super__Vector_impl_data._M_start; pRVar33 = pRVar11,
        pVVar34 !=
        uniformValues.super__Vector_base<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>.
        _M_impl.super__Vector_impl_data._M_finish; pVVar34 = pVVar34 + 1) {
      uVar21 = (**(code **)(*plVar9 + 0x330))
                         (plVar9,uVar45,(pVVar34->m_variable->m_name)._M_dataplus._M_p);
      pVVar4 = pVVar34->m_variable;
      TVar2 = (pVVar4->m_type).m_baseType;
      if (TYPE_SAMPLER_CUBE < TVar2) {
LAB_00472226:
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::InternalError::InternalError
                  ((InternalError *)this_00,"Unsupported type","",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsFragOpInteractionCase.cpp"
                   ,0x169);
        ppuVar36 = &tcu::InternalError::typeinfo;
LAB_00472217:
        __cxa_throw(this_00,ppuVar36,tcu::Exception::~Exception);
      }
      pSVar10 = (pVVar34->m_storage).m_value.
                super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((0xccU >> (TVar2 & 0x1f) & 1) == 0) {
        if (TVar2 != TYPE_FLOAT) goto LAB_00472226;
        uVar14 = (pVVar4->m_type).m_numElements - 1;
        uVar35 = (ulong)uVar14;
        lVar32 = 0x2e0;
        if (3 < uVar14) {
          this_00 = (TestError *)__cxa_allocate_exception(0x38,0x2e0,uVar35,pSVar10);
          tcu::TestError::TestError
                    (this_00,"Unsupported type",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsFragOpInteractionCase.cpp"
                     ,0x156);
          goto LAB_00472210;
        }
      }
      else {
        uVar14 = (pVVar4->m_type).m_numElements - 1;
        uVar35 = (ulong)uVar14;
        lVar32 = 0x300;
        if (3 < uVar14) {
          this_00 = (TestError *)__cxa_allocate_exception(0x38,0x300,uVar35,pSVar10);
          tcu::TestError::TestError
                    (this_00,"Unsupported type",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsFragOpInteractionCase.cpp"
                     ,0x164);
LAB_00472210:
          ppuVar36 = &tcu::TestError::typeinfo;
          goto LAB_00472217;
        }
      }
      (**(code **)(*plVar9 + lVar32 + uVar35 * 8))(plVar9,uVar21,1);
    }
    for (; pRVar33 != pRVar24; pRVar33 = pRVar33 + 1) {
      if ((pRVar33->state).scissorTestEnabled == true) {
        (**(code **)(*plVar9 + 0x198))(plVar9,0xc11);
        (**(code **)(*plVar9 + 400))
                  (plVar9,(pRVar33->state).scissorRectangle.left,
                   (pRVar33->state).scissorRectangle.bottom,(pRVar33->state).scissorRectangle.width,
                   (pRVar33->state).scissorRectangle.height);
      }
      else {
        (**(code **)(*plVar9 + 0x1a0))(plVar9,0xc11);
      }
      if ((pRVar33->state).stencilTestEnabled == true) {
        (**(code **)(*plVar9 + 0x198))(plVar9,0xb90);
        for (lVar32 = 0x44; lVar32 != 0x7c; lVar32 = lVar32 + 0x1c) {
          uVar14 = lVar32 == 0x60 | 0x404;
          (**(code **)(*plVar9 + 0x1b8))
                    (plVar9,uVar14,*(undefined4 *)((long)(&(pRVar33->quad).posA + -3) + lVar32),
                     *(undefined4 *)((long)(pRVar33->quad).posA.m_data + lVar32 + -0x14),
                     *(undefined4 *)((long)(&pRVar33->quad + -1) + lVar32));
          (**(code **)(*plVar9 + 0x1c0))
                    (plVar9,uVar14,
                     *(undefined4 *)((long)(pRVar33->quad).posA.m_data + lVar32 + -0xc),
                     *(undefined4 *)((long)(&(pRVar33->quad).posA + -1) + lVar32),
                     *(undefined4 *)((long)(pRVar33->quad).posA.m_data + lVar32 + -4));
          (**(code **)(*plVar9 + 0x238))
                    (plVar9,uVar14,*(undefined4 *)((long)(pRVar33->quad).posA.m_data + lVar32));
        }
      }
      else {
        (**(code **)(*plVar9 + 0x1a0))(plVar9,0xb90);
      }
      if ((pRVar33->state).depthTestEnabled == true) {
        (**(code **)(*plVar9 + 0x198))(plVar9,0xb71);
        (**(code **)(*plVar9 + 0x1c8))(plVar9,(pRVar33->state).depthFunc);
        uVar35 = (ulong)(pRVar33->state).depthWriteMask;
        puVar26 = (undefined8 *)(*plVar9 + 0x228);
      }
      else {
        puVar26 = (undefined8 *)(*plVar9 + 0x1a0);
        uVar35 = 0xb71;
      }
      (*(code *)*puVar26)(plVar9,uVar35);
      if ((pRVar33->state).blendEnabled == true) {
        (**(code **)(*plVar9 + 0x198))(plVar9,0xbe2);
        (**(code **)(*plVar9 + 0x200))
                  (plVar9,(pRVar33->state).blendRGBState.equation,
                   (pRVar33->state).blendAState.equation);
        (**(code **)(*plVar9 + 0x210))
                  (plVar9,(pRVar33->state).blendRGBState.srcFunc,
                   (pRVar33->state).blendRGBState.dstFunc,(pRVar33->state).blendAState.srcFunc,
                   (pRVar33->state).blendAState.dstFunc);
        (**(code **)(*plVar9 + 0x218))
                  ((pRVar33->state).blendColor.m_data[0],(pRVar33->state).blendColor.m_data[1],
                   (pRVar33->state).blendColor.m_data[2],(pRVar33->state).blendColor.m_data[3],
                   plVar9);
      }
      else {
        (**(code **)(*plVar9 + 0x1a0))(plVar9,0xbe2);
      }
      (**(code **)(*plVar9 + 0x198 + (ulong)((pRVar33->state).ditherEnabled ^ 1) * 8))(plVar9,0xbd0)
      ;
      (**(code **)(*plVar9 + 0x220))
                (plVar9,(pRVar33->state).colorMask.m_data[0],(pRVar33->state).colorMask.m_data[1],
                 (pRVar33->state).colorMask.m_data[2],(pRVar33->state).colorMask.m_data[3]);
      fVar1 = pRVar33->depth;
      indices[0] = 0;
      indices[1] = 1;
      indices[2] = 2;
      indices[3] = 2;
      indices[4] = 1;
      indices[5] = 3;
      iVar20 = (pRVar33->quad).posB.m_data[1];
      iVar28 = (pRVar33->quad).posA.m_data[1];
      uVar21 = 0x3f800000;
      TVar44 = 0xbf800000;
      uVar45 = 0xbf800000;
      iVar22 = iVar28 - iVar20;
      iVar17 = iVar20;
      if (iVar28 < iVar20) {
        iVar17 = iVar28;
      }
      if (iVar22 == 0 || iVar28 < iVar20) {
        uVar21 = 0xbf800000;
        uVar45 = 0x3f800000;
      }
      iVar20 = (pRVar33->quad).posB.m_data[0];
      iVar28 = (pRVar33->quad).posA.m_data[0];
      TVar46 = 0x3f800000;
      iVar16 = iVar28 - iVar20;
      iVar18 = iVar20;
      if (iVar28 < iVar20) {
        iVar18 = iVar28;
      }
      if (iVar16 == 0 || iVar28 < iVar20) {
        TVar46 = 0xbf800000;
        TVar44 = 0x3f800000;
      }
      iVar20 = -iVar16;
      if (0 < iVar16) {
        iVar20 = iVar16;
      }
      iVar28 = -iVar22;
      if (0 < iVar22) {
        iVar28 = iVar22;
      }
      layoutEntry.binding.name._M_dataplus._M_p._4_4_ = 0x3f800000;
      layoutEntry.binding.type = TVar46;
      layoutEntry.binding._4_4_ = uVar21;
      layoutEntry.binding.name._M_dataplus._M_p._0_4_ = fVar1;
      anon_unknown_0::setVertex<4>(&posPtr,0,(Vector<float,_4> *)&layoutEntry);
      layoutEntry.binding.name._M_dataplus._M_p._4_4_ = 0x3f800000;
      layoutEntry.binding.type = TVar44;
      layoutEntry.binding._4_4_ = uVar21;
      layoutEntry.binding.name._M_dataplus._M_p._0_4_ = fVar1;
      anon_unknown_0::setVertex<4>(&posPtr,1,(Vector<float,_4> *)&layoutEntry);
      layoutEntry.binding.name._M_dataplus._M_p._4_4_ = 0x3f800000;
      layoutEntry.binding.type = TVar46;
      layoutEntry.binding._4_4_ = uVar45;
      layoutEntry.binding.name._M_dataplus._M_p._0_4_ = fVar1;
      anon_unknown_0::setVertex<4>(&posPtr,2,(Vector<float,_4> *)&layoutEntry);
      layoutEntry.binding.name._M_dataplus._M_p._4_4_ = 0x3f800000;
      layoutEntry.binding.type = TVar44;
      layoutEntry.binding._4_4_ = uVar45;
      layoutEntry.binding.name._M_dataplus._M_p._0_4_ = fVar1;
      anon_unknown_0::setVertex<4>(&posPtr,3,(Vector<float,_4> *)&layoutEntry);
      (**(code **)(*plVar9 + 0x28))(plVar9,iVar18,iVar17,iVar20 + 1,iVar28 + 1);
      (**(code **)(*plVar9 + 0x350))(plVar9,4,6,0x1403,indices);
    }
    err = (**(code **)(*plVar9 + 0x3c8))(plVar9);
    glu::checkError(err,"Rendering failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsFragOpInteractionCase.cpp"
                    ,0x25c);
    (**(code **)(*plVar9 + 0x3c0))
              (plVar9,0,0,(this->m_viewportSize).m_data[0],(this->m_viewportSize).m_data[1],0x1908,
               0x1401,readDst[lVar37].super_ConstPixelBufferAccess.m_data);
    lVar37 = lVar37 + 1;
  } while( true );
}

Assistant:

FragOpInteractionCase::IterateResult FragOpInteractionCase::iterate (void)
{
	de::Random							rnd					(m_params.seed ^ deInt32Hash(m_iterNdx));
	const tcu::ScopedLogSection			section				(m_testCtx.getLog(), string("Iter") + de::toString(m_iterNdx), string("Iteration ") + de::toString(m_iterNdx));

	const int							positionNdx			= findShaderInputIndex(m_vertexShader.getInputs(), "dEQP_Position");

	const int							numVertices			= 4;
	VertexDataStorage					vertexData			(m_vertexShader.getInputs(), numVertices);
	std::vector<rsg::VariableValue>		uniformValues;
	std::vector<RenderCommand>			renderCmds			(NUM_COMMANDS_PER_ITERATION);

	tcu::Surface						rendered			(m_viewportSize.x(), m_viewportSize.y());
	tcu::Surface						reference			(m_viewportSize.x(), m_viewportSize.y());

	const tcu::Vec4						vtxInterpFactors[]	=
	{
		tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f),
		tcu::Vec4(1.0f, 0.0f, 0.5f, 0.5f),
		tcu::Vec4(0.0f, 1.0f, 0.5f, 0.5f),
		tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f)
	};

	rsg::computeUniformValues(rnd, uniformValues, m_unifiedUniforms);

	for (int attribNdx = 0; attribNdx < (int)m_vertexShader.getInputs().size(); ++attribNdx)
	{
		if (attribNdx == positionNdx)
			continue;

		const rsg::ShaderInput*				shaderIn		= m_vertexShader.getInputs()[attribNdx];
		const rsg::VariableType&			varType			= shaderIn->getVariable()->getType();
		const rsg::ConstValueRangeAccess	valueRange		= shaderIn->getValueRange();
		const int							numComponents	= varType.getNumElements();
		const glu::VertexArrayBinding		layoutEntry		= getEntryWithPointer(vertexData, attribNdx);

		DE_ASSERT(varType.getBaseType() == rsg::VariableType::TYPE_FLOAT);

		for (int vtxNdx = 0; vtxNdx < 4; vtxNdx++)
		{
			const int			fNdx	= (attribNdx+vtxNdx+m_iterNdx)%DE_LENGTH_OF_ARRAY(vtxInterpFactors);
			const tcu::Vec4&	f		= vtxInterpFactors[fNdx];

			switch (numComponents)
			{
				case 1:	setVertex(layoutEntry.pointer, vtxNdx, interpolateRange(valueRange, f.toWidth<1>()));	break;
				case 2:	setVertex(layoutEntry.pointer, vtxNdx, interpolateRange(valueRange, f.toWidth<2>()));	break;
				case 3:	setVertex(layoutEntry.pointer, vtxNdx, interpolateRange(valueRange, f.toWidth<3>()));	break;
				case 4:	setVertex(layoutEntry.pointer, vtxNdx, interpolateRange(valueRange, f.toWidth<4>()));	break;
				default:
					DE_ASSERT(false);
			}
		}
	}

	for (vector<RenderCommand>::iterator cmdIter = renderCmds.begin(); cmdIter != renderCmds.end(); ++cmdIter)
		computeRandomRenderCommand(rnd, *cmdIter, m_renderCtx.getType().getAPI(), m_viewportSize.x(), m_viewportSize.y());

	// Workaround for inaccurate barycentric/depth computation in current reference renderer:
	// Small bias is added to the draw call depths, in increasing order, to avoid accuracy issues in depth comparison.
	for (int cmdNdx = 0; cmdNdx < (int)renderCmds.size(); cmdNdx++)
		renderCmds[cmdNdx].depth += 0.0231725f * float(cmdNdx);

	{
		const glu::VertexArrayPointer		posPtr				= getEntryWithPointer(vertexData, positionNdx).pointer;

		sglr::Context* const				contexts[]			= { m_glCtx, &m_referenceCtx->context };
		const deUint32						programs[]			= { m_glProgram, m_refProgram };
		tcu::PixelBufferAccess				readDst[]			= { rendered.getAccess(), reference.getAccess() };

		const tcu::Vec4						accurateClearColor	= tcu::Vec4(0.0f, 0.25f, 0.5f, 1.0f);
		const tcu::Vec4						clearColor			= getWellBehavingColor(accurateClearColor, m_renderCtx.getRenderTarget().getPixelFormat());

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(contexts); ndx++)
		{
			sglr::Context&	ctx			= *contexts[ndx];
			const deUint32	program		= programs[ndx];

			setupAttributes(ctx, vertexData, program);

			ctx.disable		(GL_SCISSOR_TEST);
			ctx.colorMask	(GL_TRUE, GL_TRUE, GL_TRUE, GL_TRUE);
			ctx.depthMask	(GL_TRUE);
			ctx.stencilMask	(~0u);
			ctx.clearColor	(clearColor.x(), clearColor.y(), clearColor.z(), clearColor.w());
			ctx.clear		(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

			ctx.useProgram	(program);

			for (vector<rsg::VariableValue>::const_iterator uniformIter = uniformValues.begin(); uniformIter != uniformValues.end(); ++uniformIter)
				setUniformValue(ctx, ctx.getUniformLocation(program, uniformIter->getVariable()->getName()), uniformIter->getValue());

			for (vector<RenderCommand>::const_iterator cmdIter = renderCmds.begin(); cmdIter != renderCmds.end(); ++cmdIter)
				render(ctx, posPtr, *cmdIter);

			GLU_EXPECT_NO_ERROR(ctx.getError(), "Rendering failed");

			ctx.readPixels(0, 0, m_viewportSize.x(), m_viewportSize.y(), GL_RGBA, GL_UNSIGNED_BYTE, readDst[ndx].getDataPtr());
		}
	}

	{
		const tcu::RGBA		threshold		= m_renderCtx.getRenderTarget().getPixelFormat().getColorThreshold()+tcu::RGBA(3,3,3,3);
		const bool			compareOk		= tcu::bilinearCompare(m_testCtx.getLog(), "CompareResult", "Image comparison result", reference.getAccess(), rendered.getAccess(), threshold, tcu::COMPARE_LOG_RESULT);

		if (!compareOk)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
			return STOP;
		}
	}

	m_iterNdx += 1;
	return (m_iterNdx < NUM_ITERATIONS) ? CONTINUE : STOP;
}